

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O2

bool __thiscall CArmInstruction::Validate(CArmInstruction *this,ValidateState *state)

{
  int *ShiftAmount;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int *in_RCX;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ErrorType EVar12;
  uint uVar13;
  char *pcVar14;
  CArmInstruction *this_00;
  int num;
  anon_union_8_2_b358304e_for_ExpressionValue_1 local_48;
  string local_40 [32];
  
  uVar5 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar5;
  (this->Vars).Opcode.UseNewEncoding = false;
  (this->Vars).Opcode.UseNewType = false;
  if ((uVar5 & 3) != 0) {
    Logger::queueError<>(Warning,"Opcode not word aligned");
  }
  if (((this->Vars).Shift.UseShift == true) && ((this->Vars).Shift.ShiftByRegister == false)) {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).Shift.ShiftExpression,&(this->Vars).Shift.ShiftAmount);
    if (bVar2) {
      bVar1 = (this->Vars).Shift.Type;
      num = (this->Vars).Shift.ShiftAmount;
      in_RCX = (int *)(ulong)(uint)num;
      bVar10 = 0;
      uVar11 = 0;
      if (num != 0 || bVar1 != 1) {
        if (num == 0 && (bVar1 & 0xfe) == 2) {
          bVar10 = 0;
          uVar11 = 0;
        }
        else {
          bVar10 = 1;
          uVar11 = 0;
          if ((num != 0x20 || bVar1 != 1) && (bVar10 = 2, uVar11 = 0, num != 0x20 || bVar1 != 2)) {
            if (bVar1 == 0 && num == 0x20) {
LAB_00155b61:
              EVar12 = 0x17d123;
              piVar8 = &num;
              goto LAB_00155925;
            }
            if (bVar1 == 4) {
              bVar10 = 3;
              if (num != 1) {
                pcVar14 = "Invalid shift mode";
                goto LAB_00155933;
              }
            }
            else {
              bVar10 = bVar1;
              uVar11 = num;
              if (0x20 < (uint)num) goto LAB_00155b61;
            }
          }
        }
      }
      (this->Vars).Shift.FinalType = bVar10;
      (this->Vars).Shift.FinalShiftAmount = uVar11;
      (this->Vars).Shift.UseFinal = true;
      goto LAB_0015584c;
    }
LAB_0015592c:
    pcVar14 = "Invalid expression";
LAB_00155933:
    Logger::queueError<>(Error,pcVar14);
    return false;
  }
LAB_0015584c:
  uVar11 = (uint)(this->Opcode).flags;
  if ((uVar11 >> 0x16 & 1) != 0) {
    piVar8 = &(this->Vars).CopData.Cpop;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpopExpression,piVar8);
    if (!bVar2) goto LAB_0015592c;
    if (0xf < *piVar8) {
      EVar12 = 0x17d157;
      goto LAB_00155925;
    }
    uVar11 = (uint)(this->Opcode).flags;
  }
  if ((uVar11 >> 0x17 & 1) != 0) {
    piVar8 = &(this->Vars).CopData.Cpinf;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpinfExpression,piVar8);
    if (!bVar2) goto LAB_0015592c;
    if (7 < *piVar8) {
      EVar12 = 0x17d172;
LAB_00155925:
      Logger::queueError<int>((Logger *)0x1,EVar12,(char *)piVar8,in_RCX);
      return false;
    }
    uVar11 = (uint)(this->Opcode).flags;
  }
  if ((uVar11 >> 0x18 & 1) != 0) {
    ArmRegisterValue::operator=(&(this->Vars).rn,&(this->Vars).rd);
    uVar11 = (uint)(this->Opcode).flags;
  }
  if ((uVar11 >> 0x19 & 1) != 0) {
    ArmRegisterValue::operator=(&(this->Vars).rm,&(this->Vars).rd);
    uVar11 = (uint)(this->Opcode).flags;
  }
  if (((uVar11 >> 0x1b & 1) != 0) && (((this->Vars).rd.num & 1) != 0)) {
    pcVar14 = "rd must be even";
    goto LAB_00155933;
  }
  if ((uVar11 & 0x20) == 0) {
    FileManager::advanceMemory(g_fileManager,4);
    return false;
  }
  Expression::evaluate((ExpressionValue *)&num,&(this->Vars).ImmediateExpression);
  pcVar14 = "Invalid expression type";
  if (num == 2) {
    if (((this->Opcode).flags & 0x18000) != 0) {
      local_48.intValue._0_4_ =
           getFloatBits((float)(double)CONCAT44(local_48.intValue._4_4_,local_48.intValue._0_4_));
      goto LAB_001559b7;
    }
  }
  else if (num == 1) {
LAB_001559b7:
    (this->Vars).Immediate = local_48.intValue._0_4_;
    (this->Vars).OriginalImmediate = local_48.intValue._0_4_;
    (this->Vars).negative = false;
    this_00 = (CArmInstruction *)g_fileManager;
    FileManager::advanceMemory(g_fileManager,4);
    piVar8 = &(this->Vars).OriginalImmediate;
    uVar5 = (this->Opcode).flags;
    uVar11 = (uint)uVar5;
    if ((short)uVar5 < 0) {
      (this->Vars).negative = false;
      piVar7 = (int *)(uVar5 >> 0x11 & 0x7fff);
      uVar11 = (this->Vars).Immediate;
      if (((int)uVar11 < 0 & (byte)piVar7) == 1) {
        uVar11 = -uVar11;
        (this->Vars).Immediate = uVar11;
        (this->Vars).negative = true;
      }
      if ((uVar5 >> 0x20 & 1) != 0) {
        uVar11 = (uVar11 - ((uint)this->RamPos & 0xfffffffc)) - 8;
        (this->Vars).Immediate = uVar11;
        if ((int)uVar11 < 0) {
          (this->Vars).Opcode.NewEncoding = (this->Opcode).encoding ^ 0xc00000;
          (this->Vars).Opcode.UseNewEncoding = true;
          uVar11 = -uVar11;
          (this->Vars).Immediate = uVar11;
        }
      }
      ShiftAmount = &(this->Vars).Shift.ShiftAmount;
      iVar4 = getShiftedImmediate(this_00,uVar11,ShiftAmount);
      if (iVar4 != -1) goto LAB_00155cc2;
      uVar5 = (this->Opcode).flags;
      uVar11 = (uint)uVar5;
      if ((uVar11 >> 0x1c & 1) != 0) {
        uVar6 = (this->Vars).Immediate;
        uVar9 = (this->Opcode).encoding;
        if ((uVar11 >> 0x1d & 1) == 0) {
          if ((uVar11 >> 0x1e & 1) != 0) {
            uVar9 = uVar9 ^ 0x1c00000;
            goto LAB_00155cac;
          }
          if ((int)uVar11 < 0) {
            uVar9 = uVar9 ^ 0x200000;
LAB_00155d35:
            uVar6 = -uVar6;
          }
          else if ((uVar5 >> 0x21 & 1) != 0) {
            uVar9 = uVar9 ^ 0xc00000;
            goto LAB_00155d35;
          }
        }
        else {
          uVar9 = uVar9 ^ 0x400000;
LAB_00155cac:
          uVar6 = ~uVar6;
        }
        iVar4 = getShiftedImmediate(this_00,uVar6,ShiftAmount);
        if (iVar4 != -1) {
          (this->Vars).Opcode.NewEncoding = uVar9;
          (this->Vars).Opcode.UseNewEncoding = true;
          goto LAB_00155cc2;
        }
      }
      Logger::queueError<int>((Logger *)0x1,0x17d1b5,(char *)piVar8,piVar7);
    }
    else {
      if ((uVar11 >> 0x10 & 1) == 0) {
        if ((uVar11 >> 0x12 & 1) != 0) {
          uVar11 = (this->Vars).Immediate;
          if ((char)uVar5 < '\0') {
            if ((uVar11 & 1) == 0) goto LAB_00155be5;
            pcVar14 = "Branch target must be halfword aligned";
          }
          else {
            if ((uVar11 & 3) == 0) {
LAB_00155be5:
              uVar6 = (uVar11 - (int)this->RamPos) - 8;
              piVar7 = (int *)(ulong)uVar6;
              (this->Vars).Immediate = uVar6;
              uVar11 = -uVar6;
              if (0 < (int)uVar6) {
                uVar11 = uVar6;
              }
              if (0x1ffffff < uVar11) {
                EVar12 = 0x17ca0f;
                goto LAB_00155c0d;
              }
              goto LAB_00155cc8;
            }
            pcVar14 = "Branch target must be word aligned";
          }
          goto LAB_00155c87;
        }
        if ((uVar11 >> 0x13 & 1) == 0) {
          if ((uVar11 >> 0x15 & 1) == 0) {
            if (((uVar11 >> 0x11 & 1) != 0) && (iVar4 = (this->Vars).Immediate, iVar4 < 0)) {
              (this->Vars).Immediate = -iVar4;
              (this->Vars).negative = true;
            }
          }
          else if ((this->arch < AARCH_3DS) && (iVar4 = (this->Vars).Immediate, iVar4 < 0xff)) {
            iVar4 = iVar4 << 0x10;
            (this->Vars).Immediate = iVar4;
            (this->Vars).OriginalImmediate = iVar4;
          }
        }
        else {
          iVar3 = ((this->Vars).Immediate - (int)this->RamPos) + -8;
          iVar4 = -iVar3;
          if (0 < iVar3) {
            iVar4 = iVar3;
          }
          (this->Vars).Immediate = iVar3;
          bVar1 = (byte)(this->Vars).ImmediateBitLen;
          piVar7 = (int *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
          if (1 << (bVar1 & 0x1f) <= iVar4) {
            EVar12 = 0x17d1d4;
LAB_00155c0d:
            Logger::queueError<int>((Logger *)0x1,EVar12,(char *)piVar8,piVar7);
            goto LAB_00155d20;
          }
        }
      }
      else {
        piVar7 = &(this->Vars).Shift.ShiftAmount;
        iVar4 = getShiftedImmediate(this_00,(this->Vars).Immediate,piVar7);
        if (iVar4 == -1) {
          iVar4 = getShiftedImmediate(this_00,~(this->Vars).Immediate,piVar7);
          if (iVar4 == -1) {
            CArmArchitecture::addPoolValue
                      (&Arm,&this->super_ArmOpcodeCommand,(this->Vars).Immediate);
            goto LAB_00155cc8;
          }
          (this->Vars).Opcode.NewEncoding = 0x3e00000;
        }
        else {
          (this->Vars).Opcode.NewEncoding = 0x3a00000;
        }
        (this->Vars).Opcode.NewType = '\x02';
        (this->Vars).Opcode.UseNewEncoding = true;
        (this->Vars).Opcode.UseNewType = true;
LAB_00155cc2:
        (this->Vars).Immediate = iVar4;
      }
LAB_00155cc8:
      uVar11 = (this->Vars).ImmediateBitLen;
      if ((uVar11 != 0x20) && (uVar6 = (uint)(this->Opcode).flags, (uVar6 >> 0x13 & 1) == 0)) {
        uVar9 = (this->Vars).Immediate;
        uVar13 = -uVar9;
        if (0 < (int)uVar9) {
          uVar13 = uVar9;
        }
        if ((uVar6 >> 0x11 & 1) == 0) {
          uVar13 = uVar9;
        }
        if (uVar13 >> ((byte)uVar11 & 0x1f) != 0) {
          Logger::queueError<int>((Logger *)0x1,0x17d1f2,(char *)piVar8,(int *)(ulong)uVar11);
        }
      }
    }
    goto LAB_00155d20;
  }
LAB_00155c87:
  Logger::queueError<>(Error,pcVar14);
LAB_00155d20:
  std::__cxx11::string::~string(local_40);
  return false;
}

Assistant:

bool CArmInstruction::Validate(const ValidateState &state)
{
	RamPos = g_fileManager->getVirtualAddress();

	Vars.Opcode.UseNewEncoding = false;
	Vars.Opcode.UseNewType = false;


	if (RamPos & 3)
	{
		Logger::queueError(Logger::Warning, "Opcode not word aligned");
	}

	if (Vars.Shift.UseShift && !Vars.Shift.ShiftByRegister)
	{
		if (!Vars.Shift.ShiftExpression.evaluateInteger(Vars.Shift.ShiftAmount))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		int mode = Vars.Shift.Type;
		int num = Vars.Shift.ShiftAmount;

		if (num == 0 && mode == ARM_SHIFT_LSR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ASR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ROR) mode = ARM_SHIFT_LSL;
		else if (num == 32 && mode == ARM_SHIFT_LSR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_ASR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_LSL)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		} else if (mode == ARM_SHIFT_RRX)
		{
			if (num != 1)
			{
				Logger::queueError(Logger::Error, "Invalid shift mode");
				return false;
			}
			mode = ARM_SHIFT_ROR;
			num = 0;
		}

		if (num > 32 || num < 0)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		}

		Vars.Shift.FinalType = mode;
		Vars.Shift.FinalShiftAmount = num;
		Vars.Shift.UseFinal = true;
	}

	if (Opcode.flags & ARM_COPOP)
	{
		if (!Vars.CopData.CpopExpression.evaluateInteger(Vars.CopData.Cpop))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpop > 15)
		{
			Logger::queueError(Logger::Error, "CP Opc number %02X too big",Vars.CopData.Cpop);
			return false;
		}
	}

	if (Opcode.flags & ARM_COPINF)
	{
		if (!Vars.CopData.CpinfExpression.evaluateInteger(Vars.CopData.Cpinf))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpinf > 7)
		{
			Logger::queueError(Logger::Error, "CP Inf number %02X too big",Vars.CopData.Cpinf);
			return false;
		}
	}

	if (Opcode.flags & ARM_DN)
	{
		Vars.rn = Vars.rd;
	}

	if (Opcode.flags & ARM_DM)
	{
		Vars.rm = Vars.rd;
	}

	if (Opcode.flags & ARM_RDEVEN)
	{
		if (Vars.rd.num & 1)
		{
			Logger::queueError(Logger::Error, "rd must be even");
			return false;
		}
	}

	bool memoryAdvanced = false;
	if (Opcode.flags & ARM_IMMEDIATE)
	{
		ExpressionValue value = Vars.ImmediateExpression.evaluate();

		switch (value.type)
		{
		case ExpressionValueType::Integer:
			Vars.Immediate = (int) value.intValue;
			break;
		case ExpressionValueType::Float:
			if (!(Opcode.flags & ARM_SHIFT) && !(Opcode.flags & ARM_POOL))
			{
				Logger::queueError(Logger::Error, "Invalid expression type");
				return false;
			}

			Vars.Immediate = (int) getFloatBits((float)value.floatValue);
			break;
		default:
			Logger::queueError(Logger::Error, "Invalid expression type");
			return false;
		}

		Vars.OriginalImmediate = Vars.Immediate;
		Vars.negative = false;
		
		g_fileManager->advanceMemory(4);
		memoryAdvanced = true;

		if (Opcode.flags & ARM_SHIFT)	// shifted immediate, eg 4000h
		{
			int temp;
			Vars.negative = false;
			if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
			{
				Vars.Immediate = abs(Vars.Immediate);
				Vars.negative = true;
			}

			if (Opcode.flags & ARM_PCR)
			{
				Vars.Immediate = Vars.Immediate - ((RamPos+8) & ~3);
				if (Vars.Immediate < 0)
				{
					Vars.Opcode.NewEncoding = Opcode.encoding ^ 0xC00000;
					Vars.Opcode.UseNewEncoding = true;
					Vars.Immediate = abs(Vars.Immediate);
				}
			}

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) == -1)
			{
				// mov/mvn -> mvn/mov
				if ((Opcode.flags & ARM_OPTIMIZE))
				{
					auto encoding = Opcode.encoding;
					auto immediate = Vars.Immediate;

					if (Opcode.flags & ARM_OPMOVMVN)
					{
						encoding ^= 0x0400000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPANDBIC)
					{
						encoding ^= 0x1C00000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPCMPCMN)
					{
						encoding ^= 0x0200000;
						immediate = 0-immediate;
					}
					else if (Opcode.flags & ARM_OPADDSUB)
					{
						encoding ^= 0x0C00000;
						immediate = 0-immediate;
					}

					temp = getShiftedImmediate(immediate, Vars.Shift.ShiftAmount);
					if (temp != -1)
					{
						Vars.Opcode.NewEncoding = encoding;
						Vars.Opcode.UseNewEncoding = true;
					}
				}
				if (temp == -1)
				{
					// If we get here then the instruction did not contain a shifted immediate
					// and we failed to optimize into another instruction
					Logger::queueError(Logger::Error, "Invalid shifted immediate 0x%X", Vars.OriginalImmediate);
					return false;
				}
			}
			Vars.Immediate = temp;
		} else if (Opcode.flags & ARM_POOL)
		{
			int temp;

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) != -1)
			{
				// interpete ldr= as mov
				Vars.Opcode.NewEncoding = 0x03A00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else if ((temp = getShiftedImmediate(~Vars.Immediate,Vars.Shift.ShiftAmount)) != -1) 
			{
				// interprete ldr= as mvn
				Vars.Opcode.NewEncoding = 0x03E00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else {
				Arm.addPoolValue(this,Vars.Immediate);
			}
		} else if (Opcode.flags & ARM_BRANCH)
		{
			if (Opcode.flags & ARM_HALFWORD)
			{
				if (Vars.Immediate & 1)
				{
					Logger::queueError(Logger::Error, "Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (Vars.Immediate & 3)
				{
					Logger::queueError(Logger::Error, "Branch target must be word aligned");
					return false;
				}
			}

			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= 0x2000000)
			{
				Logger::queueError(Logger::Error, "Branch target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_ABSIMM)	// ldr r0,[I]
		{
			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= (1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Load target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_SWI)	// it's an interrupt, may need to shift it
		{
			bool needsShift = arch == AARCH_GBA || arch == AARCH_NDS;
			if (needsShift && Vars.Immediate < 0xFF)
			{
				Vars.Immediate <<= 16;
				Vars.OriginalImmediate = Vars.Immediate;
			}
		} else if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
		{
			Vars.Immediate = abs(Vars.Immediate);
			Vars.negative = true;
		}

		if (Vars.ImmediateBitLen != 32 && !(Opcode.flags & ARM_ABSIMM))
		{
			unsigned int check = Opcode.flags & ARM_ABS ? abs(Vars.Immediate) : Vars.Immediate;
			if (check >= (unsigned int)(1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Immediate value %X out of range",Vars.OriginalImmediate);
				return false;
			}
		}
	}
	
	if (!memoryAdvanced)
		g_fileManager->advanceMemory(4);

	return false;
}